

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O0

void fdct8x4_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  undefined4 uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int32_t *piVar21;
  char in_DL;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i x2 [4];
  __m128i x1 [4];
  __m128i cospi_m16_p48;
  __m128i cospi_p48_p16;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i __rounding;
  int32_t *cospi;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined2 local_4a8;
  undefined2 uStack_4a6;
  undefined2 uStack_4a4;
  undefined2 uStack_4a2;
  undefined2 local_498;
  undefined2 uStack_496;
  undefined2 uStack_494;
  undefined2 uStack_492;
  undefined2 local_488;
  undefined2 uStack_486;
  undefined2 uStack_484;
  undefined2 uStack_482;
  undefined2 local_478;
  undefined2 uStack_476;
  undefined2 uStack_474;
  undefined2 uStack_472;
  undefined2 uStack_460;
  undefined2 uStack_45e;
  undefined2 uStack_45c;
  undefined2 uStack_45a;
  undefined2 uStack_450;
  undefined2 uStack_44e;
  undefined2 uStack_44c;
  undefined2 uStack_44a;
  undefined2 uStack_440;
  undefined2 uStack_43e;
  undefined2 uStack_43c;
  undefined2 uStack_43a;
  undefined2 uStack_430;
  undefined2 uStack_42e;
  undefined2 uStack_42c;
  undefined2 uStack_42a;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  
  piVar21 = cospi_arr((int)in_DL);
  iVar16 = 1 << (in_DL - 1U & 0x1f);
  uVar17 = CONCAT22((short)piVar21[0x20],(short)piVar21[0x20]);
  iVar18 = (piVar21[0x20] & 0xffffU) + piVar21[0x20] * -0x10000;
  uVar19 = (uint)*(ushort *)(piVar21 + 0x30) | piVar21[0x10] << 0x10;
  uVar20 = -piVar21[0x10] & 0xffffU | piVar21[0x30] << 0x10;
  auVar22 = paddsw(*in_RDI,in_RDI[3]);
  auVar23 = psubsw(*in_RDI,in_RDI[3]);
  auVar24 = paddsw(in_RDI[1],in_RDI[2]);
  auVar25 = psubsw(in_RDI[1],in_RDI[2]);
  local_478 = auVar22._0_2_;
  uStack_476 = auVar22._2_2_;
  uStack_474 = auVar22._4_2_;
  uStack_472 = auVar22._6_2_;
  local_488 = auVar24._0_2_;
  uStack_486 = auVar24._2_2_;
  uStack_484 = auVar24._4_2_;
  uStack_482 = auVar24._6_2_;
  uStack_430 = auVar22._8_2_;
  uStack_42e = auVar22._10_2_;
  uStack_42c = auVar22._12_2_;
  uStack_42a = auVar22._14_2_;
  uStack_440 = auVar24._8_2_;
  uStack_43e = auVar24._10_2_;
  uStack_43c = auVar24._12_2_;
  uStack_43a = auVar24._14_2_;
  auVar7._2_2_ = local_488;
  auVar7._0_2_ = local_478;
  auVar7._4_2_ = uStack_476;
  auVar7._6_2_ = uStack_486;
  auVar7._10_2_ = uStack_484;
  auVar7._8_2_ = uStack_474;
  auVar7._12_2_ = uStack_472;
  auVar7._14_2_ = uStack_482;
  auVar6._8_8_ = CONCAT44(uVar17,uVar17);
  auVar6._0_8_ = CONCAT44(uVar17,uVar17);
  auVar22 = pmaddwd(auVar7,auVar6);
  auVar5._2_2_ = uStack_440;
  auVar5._0_2_ = uStack_430;
  auVar5._4_2_ = uStack_42e;
  auVar5._6_2_ = uStack_43e;
  auVar5._10_2_ = uStack_43c;
  auVar5._8_2_ = uStack_42c;
  auVar5._12_2_ = uStack_42a;
  auVar5._14_2_ = uStack_43a;
  auVar4._8_8_ = CONCAT44(uVar17,uVar17);
  auVar4._0_8_ = CONCAT44(uVar17,uVar17);
  auVar24 = pmaddwd(auVar5,auVar4);
  auVar3._2_2_ = local_488;
  auVar3._0_2_ = local_478;
  auVar3._4_2_ = uStack_476;
  auVar3._6_2_ = uStack_486;
  auVar3._10_2_ = uStack_484;
  auVar3._8_2_ = uStack_474;
  auVar3._12_2_ = uStack_472;
  auVar3._14_2_ = uStack_482;
  auVar2._8_8_ = CONCAT44(iVar18,iVar18);
  auVar2._0_8_ = CONCAT44(iVar18,iVar18);
  auVar26 = pmaddwd(auVar3,auVar2);
  auVar29._2_2_ = uStack_440;
  auVar29._0_2_ = uStack_430;
  auVar29._4_2_ = uStack_42e;
  auVar29._6_2_ = uStack_43e;
  auVar29._10_2_ = uStack_43c;
  auVar29._8_2_ = uStack_42c;
  auVar29._12_2_ = uStack_42a;
  auVar29._14_2_ = uStack_43a;
  auVar28._8_8_ = CONCAT44(iVar18,iVar18);
  auVar28._0_8_ = CONCAT44(iVar18,iVar18);
  auVar27 = pmaddwd(auVar29,auVar28);
  local_238 = auVar22._0_4_;
  iStack_234 = auVar22._4_4_;
  iStack_230 = auVar22._8_4_;
  iStack_22c = auVar22._12_4_;
  local_258 = auVar24._0_4_;
  iStack_254 = auVar24._4_4_;
  iStack_250 = auVar24._8_4_;
  iStack_24c = auVar24._12_4_;
  local_278 = auVar26._0_4_;
  iStack_274 = auVar26._4_4_;
  iStack_270 = auVar26._8_4_;
  iStack_26c = auVar26._12_4_;
  local_298 = auVar27._0_4_;
  iStack_294 = auVar27._4_4_;
  iStack_290 = auVar27._8_4_;
  iStack_28c = auVar27._12_4_;
  auVar22 = ZEXT416((uint)(int)in_DL);
  auVar24 = ZEXT416((uint)(int)in_DL);
  auVar26 = ZEXT416((uint)(int)in_DL);
  auVar27 = ZEXT416((uint)(int)in_DL);
  auVar15._4_4_ = iStack_234 + iVar16 >> auVar22;
  auVar15._0_4_ = local_238 + iVar16 >> auVar22;
  auVar15._12_4_ = iStack_22c + iVar16 >> auVar22;
  auVar15._8_4_ = iStack_230 + iVar16 >> auVar22;
  auVar14._4_4_ = iStack_254 + iVar16 >> auVar24;
  auVar14._0_4_ = local_258 + iVar16 >> auVar24;
  auVar14._12_4_ = iStack_24c + iVar16 >> auVar24;
  auVar14._8_4_ = iStack_250 + iVar16 >> auVar24;
  auVar28 = packssdw(auVar15,auVar14);
  auVar13._4_4_ = iStack_274 + iVar16 >> auVar26;
  auVar13._0_4_ = local_278 + iVar16 >> auVar26;
  auVar13._12_4_ = iStack_26c + iVar16 >> auVar26;
  auVar13._8_4_ = iStack_270 + iVar16 >> auVar26;
  auVar12._4_4_ = iStack_294 + iVar16 >> auVar27;
  auVar12._0_4_ = local_298 + iVar16 >> auVar27;
  auVar12._12_4_ = iStack_28c + iVar16 >> auVar27;
  auVar12._8_4_ = iStack_290 + iVar16 >> auVar27;
  auVar29 = packssdw(auVar13,auVar12);
  local_498 = auVar25._0_2_;
  uStack_496 = auVar25._2_2_;
  uStack_494 = auVar25._4_2_;
  uStack_492 = auVar25._6_2_;
  local_4a8 = auVar23._0_2_;
  uStack_4a6 = auVar23._2_2_;
  uStack_4a4 = auVar23._4_2_;
  uStack_4a2 = auVar23._6_2_;
  uStack_450 = auVar25._8_2_;
  uStack_44e = auVar25._10_2_;
  uStack_44c = auVar25._12_2_;
  uStack_44a = auVar25._14_2_;
  uStack_460 = auVar23._8_2_;
  uStack_45e = auVar23._10_2_;
  uStack_45c = auVar23._12_2_;
  uStack_45a = auVar23._14_2_;
  auVar1._2_2_ = local_4a8;
  auVar1._0_2_ = local_498;
  auVar1._4_2_ = uStack_496;
  auVar1._6_2_ = uStack_4a6;
  auVar1._10_2_ = uStack_4a4;
  auVar1._8_2_ = uStack_494;
  auVar1._12_2_ = uStack_492;
  auVar1._14_2_ = uStack_4a2;
  auVar30._8_8_ = CONCAT44(uVar19,uVar19);
  auVar30._0_8_ = CONCAT44(uVar19,uVar19);
  auVar30 = pmaddwd(auVar1,auVar30);
  auVar27._2_2_ = uStack_460;
  auVar27._0_2_ = uStack_450;
  auVar27._4_2_ = uStack_44e;
  auVar27._6_2_ = uStack_45e;
  auVar27._10_2_ = uStack_45c;
  auVar27._8_2_ = uStack_44c;
  auVar27._12_2_ = uStack_44a;
  auVar27._14_2_ = uStack_45a;
  auVar26._8_8_ = CONCAT44(uVar19,uVar19);
  auVar26._0_8_ = CONCAT44(uVar19,uVar19);
  auVar26 = pmaddwd(auVar27,auVar26);
  auVar25._2_2_ = local_4a8;
  auVar25._0_2_ = local_498;
  auVar25._4_2_ = uStack_496;
  auVar25._6_2_ = uStack_4a6;
  auVar25._10_2_ = uStack_4a4;
  auVar25._8_2_ = uStack_494;
  auVar25._12_2_ = uStack_492;
  auVar25._14_2_ = uStack_4a2;
  auVar24._8_8_ = CONCAT44(uVar20,uVar20);
  auVar24._0_8_ = CONCAT44(uVar20,uVar20);
  auVar24 = pmaddwd(auVar25,auVar24);
  auVar23._2_2_ = uStack_460;
  auVar23._0_2_ = uStack_450;
  auVar23._4_2_ = uStack_44e;
  auVar23._6_2_ = uStack_45e;
  auVar23._10_2_ = uStack_45c;
  auVar23._8_2_ = uStack_44c;
  auVar23._12_2_ = uStack_44a;
  auVar23._14_2_ = uStack_45a;
  auVar22._8_8_ = CONCAT44(uVar20,uVar20);
  auVar22._0_8_ = CONCAT44(uVar20,uVar20);
  auVar22 = pmaddwd(auVar23,auVar22);
  local_2b8 = auVar30._0_4_;
  iStack_2b4 = auVar30._4_4_;
  iStack_2b0 = auVar30._8_4_;
  iStack_2ac = auVar30._12_4_;
  local_2d8 = auVar26._0_4_;
  iStack_2d4 = auVar26._4_4_;
  iStack_2d0 = auVar26._8_4_;
  iStack_2cc = auVar26._12_4_;
  local_2f8 = auVar24._0_4_;
  iStack_2f4 = auVar24._4_4_;
  iStack_2f0 = auVar24._8_4_;
  iStack_2ec = auVar24._12_4_;
  local_318 = auVar22._0_4_;
  iStack_314 = auVar22._4_4_;
  iStack_310 = auVar22._8_4_;
  iStack_30c = auVar22._12_4_;
  auVar22 = ZEXT416((uint)(int)in_DL);
  auVar23 = ZEXT416((uint)(int)in_DL);
  auVar24 = ZEXT416((uint)(int)in_DL);
  auVar25 = ZEXT416((uint)(int)in_DL);
  auVar11._4_4_ = iStack_2b4 + iVar16 >> auVar22;
  auVar11._0_4_ = local_2b8 + iVar16 >> auVar22;
  auVar11._12_4_ = iStack_2ac + iVar16 >> auVar22;
  auVar11._8_4_ = iStack_2b0 + iVar16 >> auVar22;
  auVar10._4_4_ = iStack_2d4 + iVar16 >> auVar23;
  auVar10._0_4_ = local_2d8 + iVar16 >> auVar23;
  auVar10._12_4_ = iStack_2cc + iVar16 >> auVar23;
  auVar10._8_4_ = iStack_2d0 + iVar16 >> auVar23;
  auVar22 = packssdw(auVar11,auVar10);
  auVar9._4_4_ = iStack_2f4 + iVar16 >> auVar24;
  auVar9._0_4_ = local_2f8 + iVar16 >> auVar24;
  auVar9._12_4_ = iStack_2ec + iVar16 >> auVar24;
  auVar9._8_4_ = iStack_2f0 + iVar16 >> auVar24;
  auVar8._4_4_ = iStack_314 + iVar16 >> auVar25;
  auVar8._0_4_ = local_318 + iVar16 >> auVar25;
  auVar8._12_4_ = iStack_30c + iVar16 >> auVar25;
  auVar8._8_4_ = iStack_310 + iVar16 >> auVar25;
  auVar23 = packssdw(auVar9,auVar8);
  local_638 = auVar28._0_8_;
  uStack_630 = auVar28._8_8_;
  *in_RSI = local_638;
  in_RSI[1] = uStack_630;
  local_618 = auVar22._0_8_;
  uStack_610 = auVar22._8_8_;
  in_RSI[2] = local_618;
  in_RSI[3] = uStack_610;
  local_628 = auVar29._0_8_;
  uStack_620 = auVar29._8_8_;
  in_RSI[4] = local_628;
  in_RSI[5] = uStack_620;
  local_608 = auVar23._0_8_;
  uStack_600 = auVar23._8_8_;
  in_RSI[6] = local_608;
  in_RSI[7] = uStack_600;
  return;
}

Assistant:

static void fdct8x4_new_sse2(const __m128i *input, __m128i *output,
                             int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));

  __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);

  // stage 1
  __m128i x1[4];
  x1[0] = _mm_adds_epi16(input[0], input[3]);
  x1[3] = _mm_subs_epi16(input[0], input[3]);
  x1[1] = _mm_adds_epi16(input[1], input[2]);
  x1[2] = _mm_subs_epi16(input[1], input[2]);

  // stage 2
  __m128i x2[4];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x1[0], x1[1], x2[0], x2[1]);
  btf_16_sse2(cospi_p48_p16, cospi_m16_p48, x1[2], x1[3], x2[2], x2[3]);

  // stage 3
  output[0] = x2[0];
  output[1] = x2[2];
  output[2] = x2[1];
  output[3] = x2[3];
}